

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_certificate_unittest.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::ParseSubjectKeyIdentifierTest_ExtraData_Test::
~ParseSubjectKeyIdentifierTest_ExtraData_Test(ParseSubjectKeyIdentifierTest_ExtraData_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ParseSubjectKeyIdentifierTest, ExtraData) {
  // OCTET_STRING {`abcd`}
  // NULL
  const uint8_t kInput[] = {0x04, 0x02, 0xab, 0xcd, 0x05};
  der::Input subject_key_identifier;
  EXPECT_FALSE(
      ParseSubjectKeyIdentifier(der::Input(kInput), &subject_key_identifier));
}